

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O1

Wlc_Ntk_t * Smt_PrsBuild(Smt_Prs_t *p)

{
  Vec_Int_t *pVVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int Entry;
  uint uVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  char *pcVar8;
  Wlc_Ntk_t *p_01;
  Abc_Nam_t *pAVar9;
  char *pcVar10;
  Vec_Int_t *pVVar11;
  void *__ptr;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  char *pStr;
  long lVar15;
  long lVar16;
  int fFound;
  int local_38;
  int local_34;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(400);
  p_00->pArray = piVar7;
  if ((p->vObjs).nSize < 1) {
LAB_003119fd:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar11 = (p->vObjs).pArray;
  if (0 < pVVar11->nSize) {
    lVar15 = 0;
    do {
      uVar3 = pVVar11->pArray[lVar15];
      if ((int)uVar3 < 0) goto LAB_003119bf;
      if ((uVar3 & 1) != 0) {
        __assert_fail("!Smt_EntryIsName(Fan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x1ec,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      uVar3 = uVar3 >> 1;
      if ((p->vObjs).nSize <= (int)uVar3) goto LAB_003119fd;
      pVVar1 = (p->vObjs).pArray;
      if (pVVar1[uVar3].nSize < 1) goto LAB_003119de;
      uVar3 = *pVVar1[uVar3].pArray;
      if ((int)uVar3 < 0) goto LAB_003119bf;
      if ((uVar3 & 1) == 0) {
        __assert_fail("Smt_EntryIsName(Fan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x1ef,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      if (0x15 < uVar3) {
        pcVar8 = Abc_NamStr(p->pStrs,uVar3 >> 1);
        printf("Ignoring directive \"%s\".\n",pcVar8);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar11->nSize);
  }
  p_01 = Wlc_NtkAlloc(p->pName,1000);
  pAVar9 = Abc_NamStart(1000,0x18);
  p_01->pManName = pAVar9;
  p_01->fSmtLib = 1;
  if (0 < (p->vObjs).nSize) {
    pVVar11 = &p_01->vValues;
    lVar16 = 0;
    lVar15 = 8;
    iVar14 = 0;
    do {
      pVVar1 = (p->vObjs).pArray;
      iVar4 = *(int *)((long)pVVar1 + lVar15 + -4);
      if (0 < iVar4) {
        iVar5 = **(int **)((long)&pVVar1->nCap + lVar15);
        if (iVar5 < 0) goto LAB_003119bf;
        if (iVar5 == 0xb) {
          if (iVar4 != 4) {
            __assert_fail("Vec_IntSize(vFans) == 4",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x1f9,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          iVar4 = **(int **)((long)&pVVar1->nCap + lVar15);
          if (iVar4 < 0) goto LAB_003119bf;
          if (iVar4 != 0xb) {
            __assert_fail("Smt_VecEntryIsType(vFans, 0, SMT_PRS_DECLARE_FUN)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x1fa,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          uVar3 = *(uint *)(*(long *)((long)&pVVar1->nCap + lVar15) + 4);
          if ((int)uVar3 < 0) goto LAB_003119bf;
          if ((uVar3 & 1) == 0) {
            __assert_fail("Smt_EntryIsName(Fan)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x1fd,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          pcVar8 = Abc_NamStr(p->pStrs,uVar3 >> 1);
          iVar4 = *(int *)((long)pVVar1 + lVar15 + -4);
          if (iVar4 < 3) goto LAB_003119de;
          lVar2 = *(long *)((long)&pVVar1->nCap + lVar15);
          uVar3 = *(uint *)(lVar2 + 8);
          if ((int)uVar3 < 0) goto LAB_003119bf;
          if ((uVar3 & 1) != 0) {
            __assert_fail("!Smt_EntryIsName(Fan)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x201,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          if (iVar4 == 3) goto LAB_003119de;
          uVar3 = *(uint *)(lVar2 + 0xc);
          if ((int)uVar3 < 0) goto LAB_003119bf;
          if ((uVar3 & 1) == 0) {
            uVar3 = uVar3 >> 1;
            if ((p->vObjs).nSize <= (int)uVar3) goto LAB_003119fd;
            pVVar1 = (p->vObjs).pArray;
            if (pVVar1[uVar3].nSize != 3) {
              __assert_fail("Vec_IntSize(vFans2) == 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x211,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            if (*pVVar1[uVar3].pArray < 0) goto LAB_003119bf;
            pcVar10 = Abc_NamStr(p->pStrs,(uint)*pVVar1[uVar3].pArray >> 1);
            iVar4 = strcmp("_",pcVar10);
            if (iVar4 != 0) {
              __assert_fail("!strcmp(\"_\", Smt_VecEntryName(p, vFans2, 0))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x212,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            if (pVVar1[uVar3].nSize < 2) goto LAB_003119de;
            if (pVVar1[uVar3].pArray[1] < 0) goto LAB_003119bf;
            pcVar10 = Abc_NamStr(p->pStrs,(uint)pVVar1[uVar3].pArray[1] >> 1);
            iVar4 = strcmp("BitVec",pcVar10);
            if (iVar4 != 0) {
              __assert_fail("!strcmp(\"BitVec\", Smt_VecEntryName(p, vFans2, 1))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x213,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            if (pVVar1[uVar3].nSize < 3) goto LAB_003119de;
            uVar3 = pVVar1[uVar3].pArray[2];
            if ((int)uVar3 < 0) goto LAB_003119bf;
            if ((uVar3 & 1) == 0) {
              __assert_fail("Smt_EntryIsName(Fan)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x215,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            pcVar10 = Abc_NamStr(p->pStrs,uVar3 >> 1);
            iVar4 = atoi(pcVar10);
          }
          else {
            pcVar10 = Abc_NamStr(p->pStrs,uVar3 >> 1);
            iVar5 = strcmp("Bool",pcVar10);
            iVar4 = 1;
            if (iVar5 != 0) {
              __assert_fail("!strcmp(\"Bool\", Smt_VecEntryName(p, vFans, 3))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x207,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
          }
          iVar5 = Wlc_ObjAlloc(p_01,1,0,iVar4 + -1,0);
          Entry = Abc_NamStrFindOrAdd(p_01->pManName,pcVar8,(int *)0x0);
          if (iVar5 != Entry) {
            __assert_fail("iObj == NameId",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x21c,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          Vec_IntPush(pVVar11,Entry);
          Vec_IntPush(pVVar11,iVar14);
          Vec_IntPush(pVVar11,iVar4);
          iVar14 = iVar4 + iVar14;
        }
      }
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0x10;
    } while (lVar16 < (p->vObjs).nSize);
  }
  if (0 < (p->vObjs).nSize) {
    lVar16 = 8;
    lVar15 = 0;
    do {
      pVVar11 = (p->vObjs).pArray;
      iVar14 = *(int *)((long)pVVar11 + lVar16 + -4);
      if (0 < iVar14) {
        iVar4 = **(int **)((long)&pVVar11->nCap + lVar16);
        if (iVar4 < 0) goto LAB_003119bf;
        if (iVar4 == 9) {
          if (iVar14 != 5) {
            __assert_fail("Vec_IntSize(vFans) == 5",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x226,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          iVar14 = **(int **)((long)&pVVar11->nCap + lVar16);
          if (iVar14 < 0) goto LAB_003119bf;
          if (iVar14 != 9) {
            __assert_fail("Smt_VecEntryIsType(vFans, 0, SMT_PRS_DEFINE_FUN)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x227,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          uVar3 = *(uint *)(*(long *)((long)&pVVar11->nCap + lVar16) + 4);
          if ((int)uVar3 < 0) goto LAB_003119bf;
          if ((uVar3 & 1) == 0) {
            __assert_fail("Smt_EntryIsName(Fan)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x22a,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          pcVar8 = Abc_NamStr(p->pStrs,uVar3 >> 1);
          iVar14 = *(int *)((long)pVVar11 + lVar16 + -4);
          if (iVar14 < 3) {
LAB_003119de:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          lVar2 = *(long *)((long)&pVVar11->nCap + lVar16);
          uVar3 = *(uint *)(lVar2 + 8);
          if ((int)uVar3 < 0) goto LAB_003119bf;
          if ((uVar3 & 1) != 0) {
            __assert_fail("!Smt_EntryIsName(Fan)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x22e,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          if (iVar14 == 3) goto LAB_003119de;
          uVar3 = *(uint *)(lVar2 + 0xc);
          if ((int)uVar3 < 0) goto LAB_003119bf;
          if ((uVar3 & 1) == 0) {
            uVar3 = uVar3 >> 1;
            if ((p->vObjs).nSize <= (int)uVar3) goto LAB_003119fd;
            pVVar1 = (p->vObjs).pArray;
            if (pVVar1[uVar3].nSize != 3) {
              __assert_fail("Vec_IntSize(vFans2) == 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x246,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            if (*pVVar1[uVar3].pArray < 0) goto LAB_003119bf;
            pcVar10 = Abc_NamStr(p->pStrs,(uint)*pVVar1[uVar3].pArray >> 1);
            iVar14 = strcmp("_",pcVar10);
            if (iVar14 != 0) {
              __assert_fail("!strcmp(\"_\", Smt_VecEntryName(p, vFans2, 0))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x247,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            if (pVVar1[uVar3].nSize < 2) goto LAB_003119de;
            if (pVVar1[uVar3].pArray[1] < 0) goto LAB_003119bf;
            pcVar10 = Abc_NamStr(p->pStrs,(uint)pVVar1[uVar3].pArray[1] >> 1);
            iVar14 = strcmp("BitVec",pcVar10);
            if (iVar14 != 0) {
              __assert_fail("!strcmp(\"BitVec\", Smt_VecEntryName(p, vFans2, 1))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x248,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            if (pVVar1[uVar3].nSize < 3) goto LAB_003119de;
            uVar3 = pVVar1[uVar3].pArray[2];
            if ((int)uVar3 < 0) goto LAB_003119bf;
            if ((uVar3 & 1) == 0) {
              __assert_fail("Smt_EntryIsName(Fan)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x24b,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            pcVar10 = Abc_NamStr(p->pStrs,uVar3 >> 1);
            if (*(int *)((long)pVVar11 + lVar16 + -4) < 5) goto LAB_003119de;
            iVar14 = atoi(pcVar10);
            iVar14 = Smt_PrsBuildNode(p_01,p,*(int *)(*(long *)((long)&pVVar11->nCap + lVar16) +
                                                     0x10),iVar14,pcVar8);
          }
          else {
            pcVar10 = Abc_NamStr(p->pStrs,uVar3 >> 1);
            iVar14 = strcmp("Bool",pcVar10);
            if (iVar14 != 0) {
              __assert_fail("!strcmp(\"Bool\", Smt_VecEntryName(p, vFans, 3))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x234,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            if (*(int *)((long)pVVar11 + lVar16 + -4) < 5) goto LAB_003119de;
            uVar3 = *(uint *)(*(long *)((long)&pVVar11->nCap + lVar16) + 0x10);
            if ((int)uVar3 < 0) goto LAB_003119bf;
            pcVar10 = Abc_NamStr(p->pStrs,uVar3 >> 1);
            iVar14 = strcmp("false",pcVar10);
            pStr = "#b0";
            if (iVar14 != 0) {
              iVar14 = strcmp("true",pcVar10);
              pStr = "#b1";
              if (iVar14 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                              ,0x23b,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
              }
            }
            iVar14 = Smt_PrsBuildConstant(p_01,pStr,1,pcVar8);
          }
          if (iVar14 == 0) goto LAB_00311801;
        }
      }
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 0x10;
    } while (lVar15 < (p->vObjs).nSize);
  }
  if (0 < (p->vObjs).nSize) {
    lVar15 = 0;
    do {
      pVVar11 = (p->vObjs).pArray;
      if (0 < pVVar11[lVar15].nSize) {
        if (*pVVar11[lVar15].pArray < 0) goto LAB_003119bf;
        if (*pVVar11[lVar15].pArray == 0xf) {
          if (pVVar11[lVar15].nSize != 3) {
            __assert_fail("Vec_IntSize(vFans) == 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x25c,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          if (*pVVar11[lVar15].pArray < 0) goto LAB_003119bf;
          if (*pVVar11[lVar15].pArray != 0xf) {
            __assert_fail("Smt_VecEntryIsType(vFans, 0, SMT_PRS_LET)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x25d,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          uVar3 = pVVar11[lVar15].pArray[1];
          if ((int)uVar3 < 0) goto LAB_003119bf;
          if ((uVar3 & 1) != 0) {
            __assert_fail("!Smt_EntryIsName(Fan)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x260,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          uVar3 = uVar3 >> 1;
          if ((p->vObjs).nSize <= (int)uVar3) goto LAB_003119fd;
          pVVar11 = (p->vObjs).pArray;
          if (0 < pVVar11[uVar3].nSize) {
            if (*pVVar11[uVar3].pArray < 0) goto LAB_003119bf;
            if (*pVVar11[uVar3].pArray == 0xf) goto LAB_00311662;
          }
          iVar14 = pVVar11[uVar3].nSize;
          if (0 < iVar14) {
            iVar4 = 0;
            do {
              if (iVar14 < 1) goto LAB_003119de;
              uVar6 = *pVVar11[uVar3].pArray;
              if ((int)uVar6 < 0) goto LAB_003119bf;
              if ((uVar6 & 1) != 0) {
                __assert_fail("!Smt_EntryIsName(Fan)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                              ,0x269,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
              }
              uVar6 = uVar6 >> 1;
              if ((p->vObjs).nSize <= (int)uVar6) goto LAB_003119fd;
              pVVar1 = (p->vObjs).pArray;
              if (pVVar1[uVar6].nSize < 1) goto LAB_003119de;
              uVar13 = *pVVar1[uVar6].pArray;
              if ((int)uVar13 < 0) goto LAB_003119bf;
              if ((uVar13 & 1) == 0) {
                __assert_fail("Smt_EntryIsName(Fan3)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                              ,0x26d,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
              }
              pcVar8 = Abc_NamStr(p->pStrs,uVar13 >> 1);
              if (pVVar1[uVar6].nSize < 2) goto LAB_003119de;
              uVar6 = pVVar1[uVar6].pArray[1];
              if ((int)uVar6 < 0) goto LAB_003119bf;
              if ((uVar6 & 1) != 0) {
                __assert_fail("!Smt_EntryIsName(Fan3)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                              ,0x271,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
              }
              iVar14 = Smt_PrsBuildNode(p_01,p,uVar6,-1,pcVar8);
              if (iVar14 == 0) goto LAB_00311801;
              iVar4 = iVar4 + 1;
              iVar14 = pVVar11[uVar3].nSize;
            } while (iVar4 < iVar14);
          }
        }
      }
LAB_00311662:
      lVar15 = lVar15 + 1;
    } while (lVar15 < (p->vObjs).nSize);
  }
  p_00->nSize = 0;
  if (0 < (p->vObjs).nSize) {
    lVar15 = 0;
    do {
      pVVar11 = (p->vObjs).pArray;
      if (0 < pVVar11[lVar15].nSize) {
        if (*pVVar11[lVar15].pArray < 0) goto LAB_003119bf;
        if (*pVVar11[lVar15].pArray == 0xd) {
          if (pVVar11[lVar15].nSize != 2) {
            __assert_fail("Vec_IntSize(vFans) == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x282,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          if (*pVVar11[lVar15].pArray < 0) {
LAB_003119bf:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf3,"int Abc_LitIsCompl(int)");
          }
          if (*pVVar11[lVar15].pArray != 0xd) {
            __assert_fail("Smt_VecEntryIsType(vFans, 0, SMT_PRS_ASSERT)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x283,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          uVar3 = pVVar11[lVar15].pArray[1];
          if ((int)uVar3 < 0) goto LAB_003119bf;
          if ((uVar3 & 1) == 0) {
            uVar6 = uVar3 >> 1;
            if ((p->vObjs).nSize <= (int)uVar6) goto LAB_003119fd;
            pVVar11 = (p->vObjs).pArray;
            uVar13 = pVVar11[uVar6].nSize;
            if (0 < (int)uVar13) {
              pVVar11 = pVVar11 + uVar6;
              do {
                if (*pVVar11->pArray < 0) goto LAB_003119bf;
                if (*pVVar11->pArray != 0xf) break;
                if (uVar13 < 3) goto LAB_003119de;
                uVar3 = pVVar11->pArray[2];
                if ((int)uVar3 < 0) goto LAB_003119bf;
                if ((uVar3 & 1) != 0) break;
                uVar6 = uVar3 >> 1;
                if ((p->vObjs).nSize <= (int)uVar6) goto LAB_003119fd;
                pVVar1 = (p->vObjs).pArray;
                pVVar11 = pVVar1 + uVar6;
                uVar13 = pVVar1[uVar6].nSize;
              } while (0 < (int)uVar13);
            }
          }
          iVar14 = Smt_PrsBuildNode(p_01,p,uVar3,-1,(char *)0x0);
          if (iVar14 == 0) {
            Wlc_NtkFree(p_01);
            p_01 = (Wlc_Ntk_t *)0x0;
            goto LAB_0031198f;
          }
          Vec_IntPush(p_00,iVar14);
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (p->vObjs).nSize);
  }
  if (p_00->nSize == 1) {
    uVar3 = Wlc_ObjAlloc(p_01,7,0,0,0);
    if (((int)uVar3 < 1) || (p_01->nObjsAlloc <= (int)uVar3)) goto LAB_00311dbe;
    Wlc_ObjAddFanins(p_01,p_01->pObjs + uVar3,p_00);
    pAVar9 = p_01->pManName;
    piVar7 = &local_38;
  }
  else {
    iVar14 = Smt_PrsCreateNode(p_01,0x17,0,p_00->nSize,p_00,(char *)0x0);
    if (p_00->nCap < 1) {
      if (p_00->pArray == (int *)0x0) {
        piVar7 = (int *)malloc(4);
      }
      else {
        piVar7 = (int *)realloc(p_00->pArray,4);
      }
      p_00->pArray = piVar7;
      if (piVar7 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      p_00->nCap = 1;
    }
    *p_00->pArray = iVar14;
    p_00->nSize = 1;
    uVar3 = Wlc_ObjAlloc(p_01,0x25,0,0,0);
    if (((int)uVar3 < 1) || (p_01->nObjsAlloc <= (int)uVar3)) goto LAB_00311dbe;
    Wlc_ObjAddFanins(p_01,p_01->pObjs + uVar3,p_00);
    pAVar9 = p_01->pManName;
    piVar7 = &local_34;
  }
  uVar6 = Abc_NamStrFindOrAdd(pAVar9,"miter_output",piVar7);
  if (*piVar7 != 0) {
    __assert_fail("!fFound",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                  ,0x125,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
  }
  if (uVar3 != uVar6) {
    __assert_fail("iObj == NameId",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                  ,0x126,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
  }
  if (p_01->nObjsAlloc <= (int)uVar3) {
LAB_00311dbe:
    __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlc.h"
                  ,0xa9,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
  }
  __ptr = (void *)0x0;
  Wlc_ObjSetCo(p_01,p_01->pObjs + uVar3,0);
  uVar3 = p_01->iObj;
  uVar6 = 0x10;
  if (0xe < uVar3 - 1) {
    uVar6 = uVar3;
  }
  if (uVar6 != 0) {
    __ptr = malloc((long)(int)uVar6 << 2);
  }
  if (0 < (int)uVar3) {
    uVar12 = 0;
    do {
      *(int *)((long)__ptr + uVar12 * 4) = (int)uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar3 != uVar12);
  }
  if (0 < (int)uVar3) {
    uVar12 = 0;
    do {
      Vec_IntPush(&p_01->vNameIds,*(int *)((long)__ptr + uVar12 * 4));
      uVar12 = uVar12 + 1;
    } while (uVar3 != uVar12);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
LAB_0031198f:
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return p_01;
LAB_00311801:
  Wlc_NtkFree(p_01);
  p_01 = (Wlc_Ntk_t *)0x0;
  goto LAB_0031198f;
}

Assistant:

Wlc_Ntk_t * Smt_PrsBuild( Smt_Prs_t * p )
{
    Wlc_Ntk_t * pNtk;
    Vec_Int_t * vFans, * vFans2, * vFans3; 
    Vec_Int_t * vAsserts = Vec_IntAlloc(100);
    char * pName, * pRange, * pValue;
    int i, k, Fan, Fan3, iObj, Status, Range, NameId, nBits = 0;
    // issue warnings about unknown dirs
    vFans = Vec_WecEntry( &p->vObjs, 0 );
    Vec_IntForEachEntry( vFans, Fan, i )
    {
        assert( !Smt_EntryIsName(Fan) );
        vFans2 = Smt_VecEntryNode( p, vFans, i );
        Fan = Vec_IntEntry(vFans2, 0);
        assert( Smt_EntryIsName(Fan) );
        if ( Abc_Lit2Var(Fan) >= SMT_PRS_END )
            printf( "Ignoring directive \"%s\".\n", Smt_EntryName(p, Fan) );
    }
    // start network and create primary inputs
    pNtk = Wlc_NtkAlloc( p->pName, 1000 );
    pNtk->pManName = Abc_NamStart( 1000, 24 );
    pNtk->fSmtLib = 1;
    Smt_ManForEachDir( p, SMT_PRS_DECLARE_FUN, vFans, i )
    {
        assert( Vec_IntSize(vFans) == 4 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_DECLARE_FUN) );
        // get name
        Fan = Vec_IntEntry(vFans, 1);
        assert( Smt_EntryIsName(Fan) );
        pName = Smt_EntryName(p, Fan);
        // skip ()
        Fan = Vec_IntEntry(vFans, 2);
        assert( !Smt_EntryIsName(Fan) );
        // check type (Bool or BitVec)
        Fan = Vec_IntEntry(vFans, 3);
        if ( Smt_EntryIsName(Fan) ) 
        {
            //(declare-fun s1 () Bool)
            assert( !strcmp("Bool", Smt_VecEntryName(p, vFans, 3)) );
            Range = 1;
        }
        else
        {
            // (declare-fun s1 () (_ BitVec 64))
            // get range
            Fan = Vec_IntEntry(vFans, 3);
            assert( !Smt_EntryIsName(Fan) );
            vFans2 = Smt_EntryNode(p, Fan);
            assert( Vec_IntSize(vFans2) == 3 );
            assert( !strcmp("_", Smt_VecEntryName(p, vFans2, 0)) );
            assert( !strcmp("BitVec", Smt_VecEntryName(p, vFans2, 1)) );
            Fan = Vec_IntEntry(vFans2, 2);
            assert( Smt_EntryIsName(Fan) );
            pRange = Smt_EntryName(p, Fan);
            Range = atoi(pRange);
        }
        // create node
        iObj = Wlc_ObjAlloc( pNtk, WLC_OBJ_PI, 0, Range-1, 0 );
        NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pName, NULL );
        assert( iObj == NameId );
        // save values
        Vec_IntPush( &pNtk->vValues, NameId );
        Vec_IntPush( &pNtk->vValues, nBits );
        Vec_IntPush( &pNtk->vValues, Range );
        nBits += Range;
    }
    // create constants
    Smt_ManForEachDir( p, SMT_PRS_DEFINE_FUN, vFans, i )
    {
        assert( Vec_IntSize(vFans) == 5 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_DEFINE_FUN) );
        // get name
        Fan = Vec_IntEntry(vFans, 1);
        assert( Smt_EntryIsName(Fan) );
        pName = Smt_EntryName(p, Fan);
        // skip ()
        Fan = Vec_IntEntry(vFans, 2);
        assert( !Smt_EntryIsName(Fan) );
        // check type (Bool or BitVec)
        Fan = Vec_IntEntry(vFans, 3);
        if ( Smt_EntryIsName(Fan) ) 
        {
            // (define-fun s_2 () Bool false)
            assert( !strcmp("Bool", Smt_VecEntryName(p, vFans, 3)) );
            Range = 1;
            pValue = Smt_VecEntryName(p, vFans, 4);
            if ( !strcmp("false", pValue) )
                pValue = "#b0";
            else if ( !strcmp("true", pValue) )
                pValue = "#b1";
            else assert( 0 );
            Status = Smt_PrsBuildConstant( pNtk, pValue, Range, pName );
        }
        else
        {
            // (define-fun s702 () (_ BitVec 4) #xe)
            // (define-fun s1 () (_ BitVec 8) (bvneg #x7f))
            // get range
            Fan = Vec_IntEntry(vFans, 3);
            assert( !Smt_EntryIsName(Fan) );
            vFans2 = Smt_VecEntryNode(p, vFans, 3);
            assert( Vec_IntSize(vFans2) == 3 );
            assert( !strcmp("_", Smt_VecEntryName(p, vFans2, 0)) );
            assert( !strcmp("BitVec", Smt_VecEntryName(p, vFans2, 1)) );
            // get range
            Fan = Vec_IntEntry(vFans2, 2);
            assert( Smt_EntryIsName(Fan) );
            pRange = Smt_EntryName(p, Fan);
            Range = atoi(pRange);
            // get constant
            Fan = Vec_IntEntry(vFans, 4);
            Status = Smt_PrsBuildNode( pNtk, p, Fan, Range, pName );
        }        
        if ( !Status )
        {
            Wlc_NtkFree( pNtk ); pNtk = NULL;
            goto finish;
        }
    }
    // process let-statements
    Smt_ManForEachDir( p, SMT_PRS_LET, vFans, i )
    {
        // let ((s35550 (bvor s48 s35549)))
        assert( Vec_IntSize(vFans) == 3 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_LET) );
        // get parts
        Fan = Vec_IntEntry(vFans, 1);
        assert( !Smt_EntryIsName(Fan) );
        vFans2 = Smt_EntryNode(p, Fan);
        if ( Smt_VecEntryIsType(vFans2, 0, SMT_PRS_LET) )
            continue;
        // iterate through the parts
        Vec_IntForEachEntry( vFans2, Fan, k )
        {
            // s35550 (bvor s48 s35549)
            Fan = Vec_IntEntry(vFans2, 0);
            assert( !Smt_EntryIsName(Fan) );
            vFans3 = Smt_EntryNode(p, Fan);
            // get the name
            Fan3 = Vec_IntEntry(vFans3, 0);
            assert( Smt_EntryIsName(Fan3) );
            pName = Smt_EntryName(p, Fan3);
            // get function
            Fan3 = Vec_IntEntry(vFans3, 1);
            assert( !Smt_EntryIsName(Fan3) );
            Status = Smt_PrsBuildNode( pNtk, p, Fan3, -1, pName );
            if ( !Status )
            {
                Wlc_NtkFree( pNtk ); pNtk = NULL;
                goto finish;
            }
        }
    }
    // process assert-statements
    Vec_IntClear( vAsserts );
    Smt_ManForEachDir( p, SMT_PRS_ASSERT, vFans, i )
    {
        //(assert ; no quantifiers
        //   (let ((s2 (bvsge s0 s1)))
        //   (not s2)))
        //(assert (not (= s0 #x00)))
        assert( Vec_IntSize(vFans) == 2 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_ASSERT) );
        // get second directive
        Fan = Vec_IntEntry(vFans, 1);
        if ( !Smt_EntryIsName(Fan) )
        {
            // find the final let-statement
            vFans2 = Smt_VecEntryNode(p, vFans, 1);
            while ( Smt_VecEntryIsType(vFans2, 0, SMT_PRS_LET) )
            {
                Fan = Vec_IntEntry(vFans2, 2);
                if ( Smt_EntryIsName(Fan) )
                    break;
                vFans2 = Smt_VecEntryNode(p, vFans2, 2);
            }
        }
        // find name or create node
        iObj = Smt_PrsBuildNode( pNtk, p, Fan, -1, NULL );
        if ( !iObj )
        {
            Wlc_NtkFree( pNtk ); pNtk = NULL;
            goto finish;
        }
        Vec_IntPush( vAsserts, iObj );
    }
    // build AND of asserts
    if ( Vec_IntSize(vAsserts) == 1 )
        iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_BUF, 0, 1, vAsserts, "miter_output" );
    else
    {
        iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vAsserts), vAsserts, NULL );
        Vec_IntFill( vAsserts, 1, iObj );
        iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_REDUCT_AND, 0, 1, vAsserts, "miter_output" );
    }
    Wlc_ObjSetCo( pNtk, Wlc_NtkObj(pNtk, iObj), 0 );
    // create nameIDs
    vFans = Vec_IntStartNatural( Wlc_NtkObjNumMax(pNtk) );
    Vec_IntAppend( &pNtk->vNameIds, vFans );
    Vec_IntFree( vFans );
    //Wlc_NtkReport( pNtk, NULL );
finish:
    // cleanup
    Vec_IntFree(vAsserts);
    return pNtk;
}